

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptutil.cpp
# Opt level: O0

void __thiscall
ScriptUtil_IsValidRedeemScriptTest_Test::ScriptUtil_IsValidRedeemScriptTest_Test
          (ScriptUtil_IsValidRedeemScriptTest_Test *this)

{
  ScriptUtil_IsValidRedeemScriptTest_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__ScriptUtil_IsValidRedeemScriptTest_Test_0088e398;
  return;
}

Assistant:

TEST(ScriptUtil, IsValidRedeemScriptTest) {
  // valid script data
  Script empty_script("");
  EXPECT_TRUE(ScriptUtil::IsValidRedeemScript(empty_script));

  // valid script data
  Script valid_script_1("01000111022222033333330244440155026666037777770288880199");
  EXPECT_TRUE(ScriptUtil::IsValidRedeemScript(valid_script_1));

  // valid limit script data size ((1 + 51) * 10 byte data)
  Script valid_script_2("33000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000330000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000003300000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000033000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000330000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000003300000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000033000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000330000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000003300000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000033000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000");
  EXPECT_TRUE(ScriptUtil::IsValidRedeemScript(valid_script_2));

  // invalid script data ((1 + 51) * 10 + 1 byte data)
  Script invalid_script("3300000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000033000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000330000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000003300000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000033000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000330000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000003300000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000033000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000330000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000003400000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000");
  EXPECT_FALSE(ScriptUtil::IsValidRedeemScript(invalid_script));
}